

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::rescalePartials
          (BeagleCPUImpl<double,_1,_0> *this,double *destP,double *scaleFactors,
          double *cumulativeScaleFactors,int fillWithOnes)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  int k;
  long lVar10;
  double dVar11;
  undefined1 auVar12 [64];
  undefined1 auVar13 [16];
  
  lVar10 = 0;
  do {
    if (this->kPatternCount <= lVar10) {
      return;
    }
    auVar12 = ZEXT864(0) << 0x40;
    iVar4 = (int)lVar10 * this->kPartialsPaddedStateCount;
    iVar3 = this->kPartialsPaddedStateCount * this->kPaddedPatternCount;
    uVar5 = ~(this->kStateCount >> 0x1f) & this->kStateCount;
    uVar6 = ~(this->kCategoryCount >> 0x1f) & this->kCategoryCount;
    iVar8 = iVar4;
    for (uVar7 = 0; uVar7 != uVar6; uVar7 = uVar7 + 1) {
      lVar9 = 0;
      while (uVar5 != (uint)lVar9) {
        auVar13._8_8_ = 0;
        auVar13._0_8_ = destP[iVar8 + lVar9];
        lVar9 = lVar9 + 1;
        auVar13 = vmaxsd_avx(auVar13,auVar12._0_16_);
        auVar12 = ZEXT1664(auVar13);
      }
      iVar8 = iVar8 + iVar3;
    }
    uVar1 = vcmpsd_avx512f(auVar12._0_16_,ZEXT816(0),0);
    bVar2 = (bool)((byte)uVar1 & 1);
    dVar11 = (double)((ulong)bVar2 * 0x3ff0000000000000 + (ulong)!bVar2 * auVar12._0_8_);
    for (uVar7 = 0; uVar7 != uVar6; uVar7 = uVar7 + 1) {
      for (lVar9 = 0; uVar5 != (uint)lVar9; lVar9 = lVar9 + 1) {
        destP[iVar4 + lVar9] = (1.0 / dVar11) * destP[iVar4 + lVar9];
      }
      iVar4 = iVar4 + iVar3;
    }
    if ((this->kFlags & 0x400) == 0) {
      scaleFactors[lVar10] = dVar11;
      if (cumulativeScaleFactors != (double *)0x0) {
        dVar11 = log(dVar11);
LAB_00136776:
        cumulativeScaleFactors[lVar10] = dVar11 + cumulativeScaleFactors[lVar10];
      }
    }
    else {
      dVar11 = log(dVar11);
      scaleFactors[lVar10] = dVar11;
      if (cumulativeScaleFactors != (double *)0x0) goto LAB_00136776;
    }
    lVar10 = lVar10 + 1;
  } while( true );
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::rescalePartials(REALTYPE* destP,
        REALTYPE* scaleFactors,
        REALTYPE* cumulativeScaleFactors,
        const int  fillWithOnes) {
    if (DEBUGGING_OUTPUT) {
        std::cerr << "destP (before rescale): \n";// << destP << "\n";
        for(int i=0; i<kPartialsSize; i++)
            fprintf(stderr,"destP[%d] = %.5f\n",i,destP[i]);
    }

    // TODO None of the code below has been optimized.
    for (int k = 0; k < kPatternCount; k++) {
        REALTYPE max = 0;
        const int patternOffset = k * kPartialsPaddedStateCount;
        for (int l = 0; l < kCategoryCount; l++) {
            int offset = l * kPaddedPatternCount * kPartialsPaddedStateCount + patternOffset;
            for (int i = 0; i < kStateCount; i++) {
                if(destP[offset] > max)
                    max = destP[offset];
                offset++;
            }
        }

        if (max == 0)
            max = 1.0;

        REALTYPE oneOverMax = REALTYPE(1.0) / max;
        for (int l = 0; l < kCategoryCount; l++) {
            int offset = l * kPaddedPatternCount * kPartialsPaddedStateCount + patternOffset;
            for (int i = 0; i < kStateCount; i++)
                destP[offset++] *= oneOverMax;
        }

        if (kFlags & BEAGLE_FLAG_SCALERS_LOG) {
            REALTYPE logMax = log(max);
            scaleFactors[k] = logMax;
            if( cumulativeScaleFactors != NULL )
                cumulativeScaleFactors[k] += logMax;
        } else {
            scaleFactors[k] = max;
            if( cumulativeScaleFactors != NULL )
                cumulativeScaleFactors[k] += log(max);
        }
    }
    if (DEBUGGING_OUTPUT) {
        for(int i=0; i<kPatternCount; i++)
            fprintf(stderr,"new scaleFactor[%d] = %.5f\n",i,scaleFactors[i]);
    }
}